

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O0

int voprf_sign(VOPRF_METHOD *method,TRUST_TOKEN_ISSUER_KEY *key,CBB *cbb,CBS *cbs,
              size_t num_requested,size_t num_to_issue)

{
  int iVar1;
  EC_GROUP *group;
  undefined1 local_88 [8];
  EC_SCALAR proof_scalar;
  size_t num_to_issue_local;
  size_t num_requested_local;
  CBS *cbs_local;
  CBB *cbb_local;
  TRUST_TOKEN_ISSUER_KEY *key_local;
  VOPRF_METHOD *method_local;
  
  proof_scalar.words[8] = num_to_issue;
  group = (*method->group_func)();
  iVar1 = ec_random_nonzero_scalar(group,(EC_SCALAR *)local_88,"");
  if (iVar1 == 0) {
    method_local._4_4_ = 0;
  }
  else {
    method_local._4_4_ =
         voprf_sign_impl(method,key,cbb,cbs,num_requested,proof_scalar.words[8],
                         (EC_SCALAR *)local_88);
  }
  return method_local._4_4_;
}

Assistant:

static int voprf_sign(const VOPRF_METHOD *method,
                      const TRUST_TOKEN_ISSUER_KEY *key, CBB *cbb, CBS *cbs,
                      size_t num_requested, size_t num_to_issue) {
  EC_SCALAR proof_scalar;
  if (!ec_random_nonzero_scalar(method->group_func(), &proof_scalar,
                                kDefaultAdditionalData)) {
    return 0;
  }

  return voprf_sign_impl(method, key, cbb, cbs, num_requested, num_to_issue,
                         &proof_scalar);
}